

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dr_wav.h
# Opt level: O2

size_t drwav_read_raw(drwav *pWav,size_t bytesToRead,void *pBufferOut)

{
  size_t sVar1;
  
  if (pBufferOut == (void *)0x0 || (bytesToRead == 0 || pWav == (drwav *)0x0)) {
    return 0;
  }
  if (pWav->bytesRemaining < bytesToRead) {
    bytesToRead = pWav->bytesRemaining;
  }
  sVar1 = (*pWav->onRead)(pWav->pUserData,pBufferOut,bytesToRead);
  pWav->bytesRemaining = pWav->bytesRemaining - sVar1;
  return sVar1;
}

Assistant:

size_t drwav_read_raw(drwav* pWav, size_t bytesToRead, void* pBufferOut)
{
    if (pWav == NULL || bytesToRead == 0 || pBufferOut == NULL) {
        return 0;
    }

    if (bytesToRead > pWav->bytesRemaining) {
        bytesToRead = (size_t)pWav->bytesRemaining;
    }

    size_t bytesRead = pWav->onRead(pWav->pUserData, pBufferOut, bytesToRead);

    pWav->bytesRemaining -= bytesRead;
    return bytesRead;
}